

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O0

void __thiscall Minisat::Solver::binDRUP_strengthen(Solver *this,Clause *c,Lit l,FILE *drup_file)

{
  uchar *puVar1;
  bool bVar2;
  int iVar3;
  Clause *in_RCX;
  Lit in_EDX;
  OnlineProofChecker *in_RSI;
  Solver *in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  Lit l_00;
  Lit local_28;
  int iVar4;
  int i_00;
  Solver *pSVar5;
  
  puVar1 = in_RDI->buf_ptr;
  in_RDI->buf_ptr = puVar1 + 1;
  *puVar1 = 'a';
  in_RDI->buf_len = in_RDI->buf_len + 1;
  iVar4 = 0;
  pSVar5 = in_RDI;
  while (i_00 = iVar4, iVar3 = Clause::size((Clause *)in_RSI), iVar4 < iVar3) {
    local_28 = Clause::operator[]((Clause *)in_RSI,i_00);
    l_00.x = in_EDX.x;
    bVar2 = Lit::operator!=(&local_28,in_EDX);
    if (bVar2) {
      Clause::operator[]((Clause *)in_RSI,i_00);
      byteDRUP((Solver *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),l_00);
    }
    iVar4 = i_00 + 1;
  }
  if ((in_RDI->onlineDratChecker != (OnlineProofChecker *)0x0) &&
     (bVar2 = OnlineProofChecker::addStrengthenedClause<Minisat::Clause>
                        (in_RSI,in_RCX,(Lit)(int)((ulong)pSVar5 >> 0x20),SUB41((uint)i_00 >> 0x18,0)
                        ), !bVar2)) {
    exit(0x86);
  }
  puVar1 = in_RDI->buf_ptr;
  in_RDI->buf_ptr = puVar1 + 1;
  *puVar1 = '\0';
  in_RDI->buf_len = in_RDI->buf_len + 1;
  if (0x100000 < in_RDI->buf_len) {
    binDRUP_flush(in_RDI,(FILE *)CONCAT44(iVar4,in_stack_ffffffffffffffb8));
  }
  return;
}

Assistant:

inline void binDRUP_strengthen(const Clause &c, Lit l, FILE *drup_file)
    {
        *buf_ptr++ = 'a';
        buf_len++;
        for (int i = 0; i < c.size(); i++)
            if (c[i] != l) byteDRUP(c[i]);
        if (onlineDratChecker)
            if (!onlineDratChecker->addStrengthenedClause(c, l)) exit(134);
        *buf_ptr++ = 0;
        buf_len++;
        if (buf_len > 1048576) binDRUP_flush(drup_file);
    }